

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_WriteAdder(FILE *pFile,int nVars)

{
  uint uVar1;
  uint local_30;
  int nDigits;
  int i;
  int nVars_local;
  FILE *pFile_local;
  
  uVar1 = Abc_Base10Log(nVars);
  if (0 < nVars) {
    fprintf((FILE *)pFile,".model ADD%d\n",(ulong)(uint)nVars);
    fprintf((FILE *)pFile,".inputs");
    for (local_30 = 0; (int)local_30 < nVars; local_30 = local_30 + 1) {
      fprintf((FILE *)pFile," a%0*d",(ulong)uVar1,(ulong)local_30);
    }
    for (local_30 = 0; (int)local_30 < nVars; local_30 = local_30 + 1) {
      fprintf((FILE *)pFile," b%0*d",(ulong)uVar1,(ulong)local_30);
    }
    fprintf((FILE *)pFile,"\n");
    fprintf((FILE *)pFile,".outputs");
    for (local_30 = 0; (int)local_30 <= nVars; local_30 = local_30 + 1) {
      fprintf((FILE *)pFile," s%0*d",(ulong)uVar1,(ulong)local_30);
    }
    fprintf((FILE *)pFile,"\n");
    fprintf((FILE *)pFile,".names c\n");
    if (nVars == 1) {
      fprintf((FILE *)pFile,".subckt FA a=a0 b=b0 cin=c s=y0 cout=s1\n");
    }
    else {
      fprintf((FILE *)pFile,".subckt FA a=a%0*d b=b%0*d cin=c s=s%0*d cout=%0*d\n",(ulong)uVar1,0,
              (ulong)uVar1,0,uVar1,0,uVar1,0);
      for (local_30 = 1; (int)local_30 < nVars + -1; local_30 = local_30 + 1) {
        fprintf((FILE *)pFile,".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=%0*d\n",(ulong)uVar1
                ,(ulong)local_30,(ulong)uVar1,(ulong)local_30,uVar1,local_30 - 1,uVar1,local_30,
                uVar1,local_30);
      }
      fprintf((FILE *)pFile,".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=s%0*d\n",(ulong)uVar1,
              (ulong)local_30,(ulong)uVar1,(ulong)local_30,uVar1,local_30 - 1,uVar1,local_30,uVar1,
              local_30 + 1);
    }
    fprintf((FILE *)pFile,".end\n");
    fprintf((FILE *)pFile,"\n");
    Abc_WriteFullAdder(pFile);
    return;
  }
  __assert_fail("nVars > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcGen.c"
                ,0x5a,"void Abc_WriteAdder(FILE *, int)");
}

Assistant:

void Abc_WriteAdder( FILE * pFile, int nVars )
{
    int i, nDigits = Abc_Base10Log( nVars );

    assert( nVars > 0 );
    fprintf( pFile, ".model ADD%d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " a%0*d", nDigits, i );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " b%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i <= nVars; i++ )
        fprintf( pFile, " s%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".names c\n" );
    if ( nVars == 1 )
        fprintf( pFile, ".subckt FA a=a0 b=b0 cin=c s=y0 cout=s1\n" );
    else
    {
        fprintf( pFile, ".subckt FA a=a%0*d b=b%0*d cin=c s=s%0*d cout=%0*d\n", nDigits, 0, nDigits, 0, nDigits, 0, nDigits, 0 );
        for ( i = 1; i < nVars-1; i++ )
            fprintf( pFile, ".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=%0*d\n", nDigits, i, nDigits, i, nDigits, i-1, nDigits, i, nDigits, i );
        fprintf( pFile, ".subckt FA a=a%0*d b=b%0*d cin=%0*d s=s%0*d cout=s%0*d\n", nDigits, i, nDigits, i, nDigits, i-1, nDigits, i, nDigits, i+1 );
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    Abc_WriteFullAdder( pFile );
}